

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<TPZEqnArray<double>_> * __thiscall
TPZVec<TPZEqnArray<double>_>::operator=
          (TPZVec<TPZEqnArray<double>_> *this,initializer_list<TPZEqnArray<double>_> *list)

{
  undefined8 *puVar1;
  TPZManVector<int,_100> *this_00;
  size_type sVar2;
  iterator pTVar3;
  TPZEqnArray<double> *pTVar4;
  long lVar5;
  long lVar6;
  
  (*this->_vptr_TPZVec[3])(this,list->_M_len);
  sVar2 = list->_M_len;
  if (sVar2 != 0) {
    pTVar3 = list->_M_array;
    pTVar4 = this->fStore;
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)(pTVar3->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x28);
      this_00 = (TPZManVector<int,_100> *)
                ((long)(pTVar4->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x20);
      *(undefined8 *)(this_00[-1].fExtAlloc + 0x62) = *puVar1;
      TPZManVector<int,_100>::operator=(this_00,(TPZManVector<int,_100> *)(puVar1 + 1));
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)
                 ((long)(pTVar4->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x20),
                 (TPZManVector<int,_100> *)
                 ((long)(pTVar3->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x20))
      ;
      TPZManVector<double,_1000>::operator=
                ((TPZManVector<double,_1000> *)
                 ((long)(pTVar4->fEqValues).super_TPZManVector<double,_1000>.fExtAlloc +
                 lVar6 + -0x20),
                 (TPZManVector<double,_1000> *)
                 ((long)(pTVar3->fEqValues).super_TPZManVector<double,_1000>.fExtAlloc +
                 lVar6 + -0x20));
      TPZManVector<int,_1000>::operator=
                ((TPZManVector<int,_1000> *)
                 ((long)(pTVar4->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20),
                 (TPZManVector<int,_1000> *)
                 ((long)(pTVar3->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20));
      this_00[0x1d].fExtAlloc[0x5c] = *(int *)(puVar1 + 0x651);
      lVar5 = lVar6 + -0x28;
      lVar6 = lVar6 + 0x3290;
    } while ((iterator)((long)pTVar3[1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar5) !=
             pTVar3 + sVar2);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}